

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_gauss_s1_separable_test(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float *in_RSI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_y;
  float gauss_s1_x;
  float xs_sub_sample_x_squared;
  float xs_sub_sample_x;
  int sample_x;
  int k;
  float ys_sub_sample_y_squared;
  float ys_sub_sample_y;
  int sample_y;
  int l;
  int ys;
  int xs;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float cy_squared;
  int j;
  float cx_squared;
  int i;
  float cy;
  float cx;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  float ipoint_y;
  float ipoint_x;
  float g2_factor;
  float g1_factor;
  float scale_squared;
  int int_scale_mul_2;
  float scale;
  int local_c8;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  int local_84;
  int local_74;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  int local_54;
  int local_4c;
  float local_48;
  float local_44;
  float local_40;
  int local_3c;
  
  fVar11 = in_RSI[2];
  auVar25._8_4_ = 0x80000000;
  auVar25._0_8_ = 0x8000000080000000;
  auVar25._12_4_ = 0x80000000;
  auVar14._8_4_ = 0x3effffff;
  auVar14._0_8_ = 0x3effffff3effffff;
  auVar14._12_4_ = 0x3effffff;
  auVar2 = vpternlogd_avx512vl(auVar14,ZEXT416((uint)fVar11),auVar25,0xf8);
  vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)(fVar11 + auVar2._0_4_)),0xb);
  fVar6 = -0.08 / (fVar11 * fVar11);
  fVar1 = *in_RSI;
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar3._8_4_ = 0x3effffff;
  auVar3._0_8_ = 0x3effffff3effffff;
  auVar3._12_4_ = 0x3effffff;
  auVar2 = vpternlogd_avx512vl(auVar3,ZEXT416((uint)fVar1),auVar26,0xf8);
  auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar2._0_4_)),0xb);
  auVar5._0_8_ = (double)auVar2._0_4_;
  auVar5._8_8_ = 0;
  auVar2._0_8_ = (double)fVar11;
  auVar2._8_8_ = 0;
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar2,auVar5);
  fVar1 = in_RSI[1];
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  auVar4._8_4_ = 0x3effffff;
  auVar4._0_8_ = 0x3effffff3effffff;
  auVar4._12_4_ = 0x3effffff;
  auVar2 = vpternlogd_avx512vl(auVar4,ZEXT416((uint)fVar1),auVar27,0xf8);
  auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar2._0_4_)),0xb);
  auVar24._0_8_ = (double)auVar2._0_4_;
  auVar24._8_8_ = 0;
  auVar12._0_8_ = (double)fVar11;
  auVar12._8_8_ = 0;
  auVar2 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar12,auVar24);
  local_3c = 0;
  local_40 = 0.0;
  local_44 = -2.5;
  for (local_4c = -8; local_4c < 8; local_4c = local_4c + 5) {
    local_44 = local_44 + 1.0;
    local_48 = -2.5;
    for (local_54 = -8; local_54 < 8; local_54 = local_54 + 5) {
      local_48 = local_48 + 1.0;
      local_5c = 0.0;
      local_60 = 0.0;
      local_64 = 0.0;
      local_68 = 0.0;
      auVar15._0_4_ = (float)local_4c;
      auVar15._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar15,ZEXT416((uint)(float)auVar14._0_8_));
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar16._8_4_ = 0x3effffff;
      auVar16._0_8_ = 0x3effffff3effffff;
      auVar16._12_4_ = 0x3effffff;
      auVar3 = vpternlogd_avx512vl(auVar16,auVar12,auVar28,0xf8);
      auVar12 = vroundss_avx(auVar12,ZEXT416((uint)(auVar12._0_4_ + auVar3._0_4_)),0xb);
      auVar17._0_4_ = (float)local_54;
      auVar17._4_12_ = auVar12._4_12_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar17,ZEXT416((uint)(float)auVar2._0_8_));
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar18._8_4_ = 0x3effffff;
      auVar18._0_8_ = 0x3effffff3effffff;
      auVar18._12_4_ = 0x3effffff;
      auVar4 = vpternlogd_avx512vl(auVar18,auVar3,auVar29,0xf8);
      auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
      auVar13 = ZEXT1664(auVar3);
      for (local_74 = local_54 + -4; local_74 < local_54 + 5; local_74 = local_74 + 1) {
        auVar19._0_4_ = (float)local_74;
        auVar19._4_12_ = auVar13._4_12_;
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar19,ZEXT416((uint)(float)auVar2._0_8_));
        auVar30._8_4_ = 0x80000000;
        auVar30._0_8_ = 0x8000000080000000;
        auVar30._12_4_ = 0x80000000;
        auVar20._8_4_ = 0x3effffff;
        auVar20._0_8_ = 0x3effffff3effffff;
        auVar20._12_4_ = 0x3effffff;
        auVar5 = vpternlogd_avx512vl(auVar20,auVar4,auVar30,0xf8);
        auVar4 = vroundss_avx(auVar4,ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_)),0xb);
        fVar1 = (float)(int)auVar3._0_4_ - (float)(int)auVar4._0_4_;
        for (local_84 = local_4c + -4; auVar13 = ZEXT464(0), local_84 < local_4c + 5;
            local_84 = local_84 + 1) {
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)(float)local_84),
                                   ZEXT416((uint)(float)auVar14._0_8_));
          auVar31._8_4_ = 0x80000000;
          auVar31._0_8_ = 0x8000000080000000;
          auVar31._12_4_ = 0x80000000;
          auVar21._8_4_ = 0x3effffff;
          auVar21._0_8_ = 0x3effffff3effffff;
          auVar21._12_4_ = 0x3effffff;
          auVar5 = vpternlogd_avx512vl(auVar21,auVar4,auVar31,0xf8);
          auVar4 = vroundss_avx(auVar4,ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_)),0xb);
          fVar10 = (float)(int)auVar12._0_4_ - (float)(int)auVar4._0_4_;
          fVar7 = expf(fVar6 * fVar10 * fVar10);
          fVar8 = expf(fVar6 * fVar1 * fVar1);
          fVar9 = haarX_improved((integral_image *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (int)in_stack_ffffffffffffff4c,(int)in_stack_ffffffffffffff48,
                                 (int)in_stack_ffffffffffffff44);
          fVar10 = haarY_improved((integral_image *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  (int)in_stack_ffffffffffffff4c,(int)in_stack_ffffffffffffff48,
                                  (int)in_stack_ffffffffffffff44);
          fVar10 = fVar7 * fVar8 * fVar10;
          in_stack_ffffffffffffff54 = fVar7 * fVar8 * fVar9;
          local_5c = fVar10 + local_5c;
          local_60 = in_stack_ffffffffffffff54 + local_60;
          auVar22._8_4_ = 0x7fffffff;
          auVar22._0_8_ = 0x7fffffff7fffffff;
          auVar22._12_4_ = 0x7fffffff;
          auVar4 = vpand_avx(ZEXT416((uint)fVar10),auVar22);
          local_64 = auVar4._0_4_ + local_64;
          auVar23._8_4_ = 0x7fffffff;
          auVar23._0_8_ = 0x7fffffff7fffffff;
          auVar23._12_4_ = 0x7fffffff;
          auVar4 = vpand_avx(ZEXT416((uint)in_stack_ffffffffffffff54),auVar23);
          local_68 = auVar4._0_4_ + local_68;
        }
      }
      in_stack_ffffffffffffff50 = expf((local_44 * local_44 + local_48 * local_48) * -0.22222222);
      in_stack_ffffffffffffff4c = local_5c * in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff48 = local_60 * in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff44 = local_64 * in_stack_ffffffffffffff50;
      local_68 = local_68 * in_stack_ffffffffffffff50;
      in_RSI[(long)local_3c + 5] = in_stack_ffffffffffffff4c;
      in_RSI[(long)(local_3c + 1) + 5] = in_stack_ffffffffffffff48;
      in_RSI[(long)(local_3c + 2) + 5] = in_stack_ffffffffffffff44;
      in_RSI[(long)(local_3c + 3) + 5] = local_68;
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff4c),
                                ZEXT416((uint)in_stack_ffffffffffffff4c),
                                ZEXT416((uint)(in_stack_ffffffffffffff48 * in_stack_ffffffffffffff48
                                              )));
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff44),
                                ZEXT416((uint)in_stack_ffffffffffffff44),auVar12);
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)local_68),ZEXT416((uint)local_68),auVar12);
      local_40 = auVar12._0_4_ + local_40;
      local_3c = local_3c + 4;
    }
  }
  fVar11 = sqrtf(local_40);
  for (local_c8 = 0; local_c8 < 0x40; local_c8 = local_c8 + 1) {
    in_RSI[(long)local_c8 + 5] = (1.0 / fVar11) * in_RSI[(long)local_c8 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_gauss_s1_separable_test(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
    ideas:
        - test if gauss_s1 can be separated in x and y direction gauss_s1 = gauss_s1_x * gauss_s1_y
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    // Get the separable gaussian kernels in x and y direction
                    float gauss_s1_x = expf(g1_factor * (xs_sub_sample_x_squared));
                    float gauss_s1_y = expf(g1_factor * (ys_sub_sample_y_squared));

                    // Computing gauss_s1 2d kernel weight with separable gaussian in x and y direction
                    float gauss_s1 = gauss_s1_x * gauss_s1_y;
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Computing gauss_s2 2d kernel weight
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}